

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceputils.c
# Opt level: O1

char * key_fingerprint(X509_REQ *req)

{
  char *pcVar1;
  BIO_METHOD *type;
  BIO *bp;
  EVP_PKEY *pkey;
  long lVar2;
  char *__s;
  uchar md [16];
  uchar *data;
  MD5_CTX ctx;
  byte local_98 [16];
  void *local_88;
  MD5_CTX local_7c;
  
  pcVar1 = (char *)malloc(0x21);
  type = BIO_s_mem();
  bp = BIO_new(type);
  pkey = X509_REQ_get_pubkey((X509_REQ *)req);
  i2d_PUBKEY_bio(bp,pkey);
  lVar2 = BIO_ctrl(bp,3,0,&local_88);
  MD5_Init(&local_7c);
  MD5_Update(&local_7c,local_88,(long)(int)lVar2);
  MD5_Final(local_98,&local_7c);
  lVar2 = 0;
  __s = pcVar1;
  do {
    sprintf(__s,"%02X",(ulong)local_98[lVar2]);
    lVar2 = lVar2 + 1;
    __s = __s + 2;
  } while (lVar2 != 0x10);
  *__s = '\0';
  return pcVar1;
}

Assistant:

char* key_fingerprint(X509_REQ *req) {
    char           *ret, *str;
    unsigned char  *data, md[MD5_DIGEST_LENGTH];
    int            c, len;
    BIO            *bio;
    MD5_CTX        ctx;

    // Assign space for ASCII presentation of the digest
    str = (unsigned char *)malloc(2 * MD5_DIGEST_LENGTH + 1);
    ret = str;

    // Create new memory bio for reading the public key
    bio = BIO_new(BIO_s_mem());
    i2d_PUBKEY_bio(bio, X509_REQ_get_pubkey(req));
    len = BIO_get_mem_data(bio, &data);

    // Calculate MD5 hash:
    MD5_Init(&ctx);
    MD5_Update(&ctx, data, len);
    MD5_Final(md, &ctx);

    // Copy as ASCII string and return:
    for (c = 0; c < MD5_DIGEST_LENGTH; c++, str += 2) {
        sprintf((char *)str, "%02X", md[c]);
    }

    *(str) = '\0';
    return(ret);
}